

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong *puVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong *local_c0;
  ulong local_b8;
  
  if (bmi2 != 0) {
    sVar5 = ZSTD_encodeSequences_bmi2
                      (dst,dstCapacity,CTable_MatchLength,mlCodeTable,CTable_OffsetBits,ofCodeTable,
                       CTable_LitLength,llCodeTable,sequences,nbSeq,longOffsets);
    return sVar5;
  }
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar2 = (ushort)*CTable_MatchLength;
  uVar7 = (ulong)mlCodeTable[nbSeq - 1];
  lVar9 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
  if (uVar2 == 0) {
    lVar9 = 1;
  }
  uVar16 = CTable_MatchLength[lVar9 + uVar7 * 2 + 2] + 0x8000;
  uVar3 = (ushort)*CTable_OffsetBits;
  lVar10 = (long)(1 << ((char)uVar3 - 1U & 0x1f));
  if (uVar3 == 0) {
    lVar10 = 1;
  }
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar25 = (ulong)bVar1;
  uVar20 = CTable_OffsetBits[lVar10 + uVar25 * 2 + 2] + 0x8000;
  uVar4 = (ushort)*CTable_LitLength;
  lVar11 = (long)(1 << ((char)uVar4 - 1U & 0x1f));
  if (uVar4 == 0) {
    lVar11 = 1;
  }
  uVar12 = (ulong)llCodeTable[nbSeq - 1];
  uVar19 = CTable_LitLength[lVar11 + uVar12 * 2 + 2] + 0x8000;
  uVar21 = LL_bits[uVar12];
  uVar14 = ML_bits[uVar7] + uVar21;
  if (0x3f < uVar14) goto LAB_001128a5;
  uVar15 = (ulong)*(ushort *)
                   ((long)CTable_MatchLength +
                   (long)(int)CTable_MatchLength[lVar9 + uVar7 * 2 + 1] * 2 +
                   (ulong)((uVar16 & 0xffff0000) - CTable_MatchLength[lVar9 + uVar7 * 2 + 2] >>
                          ((byte)(uVar16 >> 0x10) & 0x3f)) * 2 + 4);
  uVar6 = (ulong)*(ushort *)
                  ((long)CTable_OffsetBits +
                  (long)(int)CTable_OffsetBits[lVar10 + uVar25 * 2 + 1] * 2 +
                  (ulong)((uVar20 & 0xffff0000) - CTable_OffsetBits[lVar10 + uVar25 * 2 + 2] >>
                         ((byte)(uVar20 >> 0x10) & 0x3f)) * 2 + 4);
  local_b8 = (ulong)*(ushort *)
                     ((long)CTable_LitLength +
                     (long)(int)CTable_LitLength[lVar11 + uVar12 * 2 + 1] * 2 +
                     (ulong)((uVar19 & 0xffff0000) - CTable_LitLength[lVar11 + uVar12 * 2 + 2] >>
                            ((byte)(uVar19 >> 0x10) & 0x3f)) * 2 + 4);
  uVar7 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar7]]) <<
          ((byte)uVar21 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar21]);
  puVar26 = (ulong *)((long)dst + (dstCapacity - 8));
  puVar8 = (ulong *)dst;
  if (longOffsets == 0) {
    if (0x1f < bVar1) goto LAB_001128c4;
    uVar16 = uVar14 + bVar1;
    if (0x3f < uVar16) goto LAB_001128a5;
    uVar20 = sequences[nbSeq - 1].offset;
  }
  else {
    uVar21 = 0x38;
    if (bVar1 < 0x38) {
      uVar21 = (uint)bVar1;
    }
    uVar16 = bVar1 - uVar21;
    if (0x38 < bVar1) {
      if (0x1f < uVar16) goto LAB_001128c4;
      uVar20 = uVar14 + uVar16;
      if (0x3f < uVar20) goto LAB_001128a5;
      if (puVar26 < dst) goto LAB_001128e3;
      uVar7 = (ulong)(sequences[nbSeq - 1].offset & BIT_mask[uVar16]) << ((byte)uVar14 & 0x3f) |
              uVar7;
      *(ulong *)dst = uVar7;
      puVar8 = (ulong *)((ulong)(uVar20 >> 3) + (long)dst);
      if (puVar26 < puVar8) {
        puVar8 = puVar26;
      }
      uVar14 = uVar20 & 7;
      uVar7 = uVar7 >> ((byte)uVar20 & 0x38);
    }
    uVar20 = sequences[nbSeq - 1].offset >> ((byte)uVar16 & 0x1f);
    if (0x1f < bVar1) goto LAB_001128c4;
    uVar16 = uVar14 + uVar21;
    if (0x3f < uVar16) goto LAB_001128a5;
    uVar25 = (ulong)uVar21;
  }
  if (puVar26 < puVar8) {
LAB_001128e3:
    __assert_fail("bitC->ptr <= bitC->endPtr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x607,"void BIT_flushBits(BIT_CStream_t *)");
  }
  uVar7 = (ulong)(uVar20 & BIT_mask[uVar25]) << ((byte)uVar14 & 0x3f) | uVar7;
  puVar13 = (ulong *)((ulong)(uVar16 >> 3) + (long)puVar8);
  if (puVar26 < puVar13) {
    puVar13 = puVar26;
  }
  *puVar8 = uVar7;
  uVar7 = uVar7 >> ((byte)uVar16 & 0x38);
  uVar16 = uVar16 & 7;
  if (1 < nbSeq) {
    uVar25 = nbSeq - 2;
    do {
      bVar1 = ofCodeTable[uVar25];
      uVar12 = (ulong)bVar1;
      uVar22 = CTable_OffsetBits[lVar10 + uVar12 * 2 + 2] + uVar6;
      if (0x1fffff < uVar22) goto LAB_001128c4;
      uVar20 = uVar16 + (int)(uVar22 >> 0x10);
      if (0x3f < uVar20) goto LAB_001128a5;
      uVar21 = (uint)uVar6;
      uVar24 = (ulong)mlCodeTable[uVar25];
      uVar18 = CTable_MatchLength[lVar9 + uVar24 * 2 + 2] + uVar15;
      if (0x1fffff < uVar18) goto LAB_001128c4;
      uVar14 = uVar20 + (int)(uVar18 >> 0x10);
      if (0x3f < uVar14) goto LAB_001128a5;
      uVar19 = (uint)uVar15;
      uVar27 = (ulong)llCodeTable[uVar25];
      uVar23 = CTable_LitLength[lVar11 + uVar27 * 2 + 2] + local_b8;
      if (0x1fffff < uVar23) goto LAB_001128c4;
      uVar17 = uVar14 + (int)(uVar23 >> 0x10);
      if (0x3f < uVar17) goto LAB_001128a5;
      uVar6 = (ulong)*(ushort *)
                      ((long)CTable_OffsetBits +
                      (long)(int)CTable_OffsetBits[lVar10 + uVar12 * 2 + 1] * 2 +
                      (uVar6 >> ((byte)(uVar22 >> 0x10) & 0x3f)) * 2 + 4);
      uVar15 = (ulong)*(ushort *)
                       ((long)CTable_MatchLength +
                       (long)(int)CTable_MatchLength[lVar9 + uVar24 * 2 + 1] * 2 +
                       (uVar15 >> ((byte)(uVar18 >> 0x10) & 0x3f)) * 2 + 4);
      uVar7 = (ulong)(BIT_mask[uVar22 >> 0x10] & uVar21) << (sbyte)uVar16 | uVar7 |
              (ulong)(BIT_mask[uVar18 >> 0x10] & uVar19) << ((byte)uVar20 & 0x3f) |
              (ulong)(BIT_mask[uVar23 >> 0x10] & (uint)local_b8) << ((byte)uVar14 & 0x3f);
      uVar16 = LL_bits[uVar27];
      uVar20 = ML_bits[uVar24];
      local_b8 = (ulong)*(ushort *)
                         ((long)CTable_LitLength +
                         (long)(int)CTable_LitLength[lVar11 + uVar27 * 2 + 1] * 2 +
                         (local_b8 >> ((byte)(uVar23 >> 0x10) & 0x3f)) * 2 + 4);
      uVar21 = uVar20 + bVar1 + uVar16;
      local_c0 = puVar13;
      if (0x1e < uVar21) {
        local_c0 = (ulong *)((ulong)(uVar17 >> 3) + (long)puVar13);
        if (puVar26 < local_c0) {
          local_c0 = puVar26;
        }
        *puVar13 = uVar7;
        uVar7 = uVar7 >> ((byte)uVar17 & 0x38);
        uVar17 = uVar17 & 7;
      }
      uVar14 = uVar17 + uVar16;
      if ((0x3f < uVar14) || (uVar19 = uVar14 + uVar20, 0x3f < uVar19)) goto LAB_001128a5;
      uVar7 = (ulong)((uint)sequences[uVar25].matchLength & BIT_mask[uVar20]) <<
              ((byte)uVar14 & 0x3f) |
              (ulong)((uint)sequences[uVar25].litLength & BIT_mask[uVar16]) << ((byte)uVar17 & 0x3f)
              | uVar7;
      if (0x38 < uVar21) {
        puVar8 = (ulong *)((ulong)(uVar19 >> 3) + (long)local_c0);
        if (puVar26 < puVar8) {
          puVar8 = puVar26;
        }
        *local_c0 = uVar7;
        uVar7 = uVar7 >> ((byte)uVar19 & 0x38);
        uVar19 = uVar19 & 7;
        local_c0 = puVar8;
      }
      if (longOffsets == 0) {
        if (0x1f < bVar1) goto LAB_001128c4;
        uVar16 = uVar19 + bVar1;
        if (0x3f < uVar16) goto LAB_001128a5;
        uVar20 = sequences[uVar25].offset;
        uVar22 = uVar12;
      }
      else {
        uVar22 = 0x38;
        if (bVar1 < 0x38) {
          uVar22 = uVar12;
        }
        uVar16 = (uint)bVar1 - (int)uVar22;
        if (0x38 < bVar1) {
          if (0x1f < uVar16) goto LAB_001128c4;
          uVar20 = uVar19 + uVar16;
          if (0x3f < uVar20) goto LAB_001128a5;
          uVar7 = (ulong)(sequences[uVar25].offset & BIT_mask[uVar16]) << ((byte)uVar19 & 0x3f) |
                  uVar7;
          puVar8 = (ulong *)((ulong)(uVar20 >> 3) + (long)local_c0);
          if (puVar26 < puVar8) {
            puVar8 = puVar26;
          }
          *local_c0 = uVar7;
          uVar7 = uVar7 >> ((byte)uVar20 & 0x38);
          uVar19 = uVar20 & 7;
          local_c0 = puVar8;
        }
        uVar20 = sequences[uVar25].offset >> ((byte)uVar16 & 0x1f);
        if (0x1f < bVar1) goto LAB_001128c4;
        uVar16 = uVar19 + (int)uVar22;
        if (0x3f < uVar16) goto LAB_001128a5;
      }
      if (puVar26 < local_c0) goto LAB_001128e3;
      uVar7 = (ulong)(uVar20 & BIT_mask[uVar22]) << ((byte)uVar19 & 0x3f) | uVar7;
      puVar13 = (ulong *)((ulong)(uVar16 >> 3) + (long)local_c0);
      if (puVar26 < puVar13) {
        puVar13 = puVar26;
      }
      *local_c0 = uVar7;
      uVar7 = uVar7 >> ((byte)uVar16 & 0x38);
      uVar25 = uVar25 - 1;
      uVar16 = uVar16 & 7;
    } while (uVar25 < nbSeq);
  }
  if (uVar2 < 0x20) {
    uVar20 = uVar16 + uVar2;
    if (uVar20 < 0x40) {
      uVar7 = (ulong)((uint)uVar15 & BIT_mask[uVar2]) << (sbyte)uVar16 | uVar7;
      puVar8 = (ulong *)((ulong)(uVar20 >> 3) + (long)puVar13);
      if (puVar26 < puVar8) {
        puVar8 = puVar26;
      }
      *puVar13 = uVar7;
      if (0x1f < uVar3) goto LAB_001128c4;
      uVar16 = (uVar20 & 7) + (uint)uVar3;
      if (uVar16 < 0x40) {
        uVar7 = (ulong)((uint)uVar6 & BIT_mask[uVar3]) << (sbyte)(uVar20 & 7) |
                uVar7 >> ((byte)uVar20 & 0x38);
        puVar13 = (ulong *)((ulong)(uVar16 >> 3) + (long)puVar8);
        if (puVar26 < puVar13) {
          puVar13 = puVar26;
        }
        *puVar8 = uVar7;
        if (0x1f < uVar4) goto LAB_001128c4;
        uVar20 = (uVar16 & 7) + (uint)uVar4;
        if (uVar20 < 0x40) {
          uVar7 = (ulong)((uint)local_b8 & BIT_mask[uVar4]) << (sbyte)(uVar16 & 7) |
                  uVar7 >> ((byte)uVar16 & 0x38);
          *puVar13 = uVar7;
          uVar16 = (uVar20 & 7) + 1;
          puVar13 = (ulong *)((ulong)(uVar20 >> 3) + (long)puVar13);
          if (puVar26 < puVar13) {
            puVar13 = puVar26;
          }
          puVar8 = (ulong *)((ulong)(uVar16 >> 3) + (long)puVar13);
          if (puVar26 < puVar8) {
            puVar8 = puVar26;
          }
          *puVar13 = uVar7 >> ((byte)uVar20 & 0x38) | 1L << (uVar20 & 7);
          sVar5 = 0;
          if (puVar8 < puVar26) {
            sVar5 = (long)puVar8 - ((long)dst + ((ulong)((uVar16 & 7) == 0) - 1));
          }
          if (sVar5 == 0) {
            return 0xffffffffffffffba;
          }
          return sVar5;
        }
      }
    }
LAB_001128a5:
    __assert_fail("nbBits + bitC->bitPos < sizeof(bitC->bitContainer) * 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x5df,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
  }
LAB_001128c4:
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5de,"void BIT_addBits(BIT_CStream_t *, size_t, unsigned int)");
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}